

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslateEH.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_157::TranslateToExnref::doWalkFunction(TranslateToExnref *this,Function *func)

{
  bool bVar1;
  pointer pTVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pTVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  Function *pFVar9;
  optional<wasm::Type> type;
  undefined8 uVar10;
  _Base_ptr p_Var11;
  mapped_type *pmVar12;
  Module *pMVar13;
  __node_base_ptr p_Var14;
  Expression *any;
  Expression *pEVar15;
  Block *pBVar16;
  ThrowRef *this_00;
  undefined8 *puVar17;
  TaskFunc p_Var18;
  char *pcVar19;
  _Rb_tree_color _Var20;
  Builder BVar21;
  undefined8 uVar22;
  _Base_ptr p_Var23;
  string_view sVar24;
  Signature SVar25;
  string local_1c0;
  LabelManager *local_1a0;
  undefined1 local_198 [248];
  undefined8 uStack_a0;
  undefined8 local_98 [2];
  undefined1 auStack_88 [32];
  undefined8 local_68;
  bool local_60;
  Expression **local_50;
  Builder local_48;
  Builder builder;
  
  LabelUtils::LabelManager::LabelManager((LabelManager *)local_198,func);
  auStack_88[0] = 1;
  local_1a0 = (LabelManager *)&this->labels;
  std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_move_assign
            ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_1a0,
             (_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_198);
  if ((bool)auStack_88[0] == true) {
    std::_Optional_payload_base<wasm::LabelUtils::LabelManager>::_M_destroy
              ((_Optional_payload_base<wasm::LabelUtils::LabelManager> *)local_198);
  }
  local_198._240_8_ = local_198 + 0xe0;
  local_198._0_8_ = (Expression **)0x0;
  local_198._8_8_ = 0;
  local_198._192_8_ = (pointer)0x0;
  local_198._176_8_ = (pointer)0x0;
  local_198._184_8_ = (pointer)0x0;
  local_198._208_8_ = (Module *)0x0;
  local_198._224_8_ = (ulong)(uint)local_198._228_4_ << 0x20;
  local_198._232_8_ = (_Base_ptr)0x0;
  local_98[0] = 0;
  auStack_88._16_8_ = auStack_88;
  auStack_88._0_8_ = auStack_88._0_8_ & 0xffffffff00000000;
  auStack_88._8_8_ = (_Base_ptr)0x0;
  local_68 = 0;
  local_50 = &func->body;
  local_198._200_8_ = func;
  uStack_a0 = local_198._240_8_;
  auStack_88._24_8_ = auStack_88._16_8_;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
              *)local_198,
             PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             ::scan,local_50);
  if (((long)(local_198._184_8_ - local_198._176_8_) >> 4) + local_198._8_8_ != 0) {
    do {
      if (local_198._176_8_ == local_198._184_8_) {
        if (local_198._8_8_ == 0) {
          pcVar19 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::Task, N = 10]"
          ;
          goto LAB_00b5c74c;
        }
        local_198._8_8_ = local_198._8_8_ - 1;
        p_Var18 = *(TaskFunc *)(local_198 + local_198._8_8_ * 0x10 + 0x10);
        local_198._0_8_ = *(undefined8 *)(local_198 + local_198._8_8_ * 0x10 + 0x18);
      }
      else {
        p_Var18 = ((pointer)(local_198._184_8_ + -0x10))->func;
        local_198._0_8_ = ((pointer)(local_198._184_8_ + -0x10))->currp;
        local_198._184_8_ = (pointer)(local_198._184_8_ + -0x10);
      }
      if (*(Expression **)local_198._0_8_ == (Expression *)0x0) {
        pcVar19 = 
        "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::TargetTryLabelScanner>]"
        ;
        goto LAB_00b5c716;
      }
      (*p_Var18)((ExnrefLocalAssigner *)local_198,(Expression **)local_198._0_8_);
    } while (((long)(local_198._184_8_ - local_198._176_8_) >> 4) + local_198._8_8_ != 0);
  }
  uVar10 = local_198._184_8_;
  uVar22 = local_198._176_8_;
  local_198._200_8_ = (Function *)0x0;
  local_60 = true;
  bVar1 = (this->labelScanner).
          super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
          .
          super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
          ._M_engaged;
  (this->labelScanner).
  super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
  ._M_payload.
  super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
  .
  super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
  ._M_payload._M_value.
  super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  .replacep = local_198._0_8_;
  (this->labelScanner).
  super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
  ._M_payload.
  super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
  .
  super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
  ._M_payload._M_value.
  super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
  .stack.usedFixed = local_198._8_8_;
  builder.wasm = (Module *)func;
  if (bVar1 == true) {
    memcpy((void *)((long)&(this->labelScanner).
                           super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                           ._M_payload.
                           super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                           .
                           super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                           ._M_payload + 0x10),local_198 + 0x10,0xa0);
    pTVar2 = (this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload._M_value.
             super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar3 = (this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload._M_value.
             super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar22;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._192_8_;
    local_198._176_8_ = (pointer)0x0;
    local_198._184_8_ = (pointer)0x0;
    local_198._192_8_ = (pointer)0x0;
    if (pTVar2 != (pointer)0x0) {
      operator_delete(pTVar2,(long)pTVar3 - (long)pTVar2);
    }
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .currFunction = (Function *)local_198._200_8_;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .currModule = (Module *)local_198._208_8_;
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload._M_value.delegateTargets._M_t);
    BVar21 = builder;
    if ((_Base_ptr)local_198._232_8_ != (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xe0) = local_198._224_4_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xe8) = local_198._232_8_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xf0) = local_198._240_8_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xf8) = uStack_a0;
      *(_Base_ptr *)(local_198._232_8_ + 8) =
           (_Base_ptr)
           ((long)&(this->labelScanner).
                   super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                   ._M_payload + 0xe0);
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x100) = local_98[0];
      local_198._232_8_ = (_Base_ptr)0x0;
      local_198._240_8_ = local_198 + 0xe0;
      local_98[0] = 0;
      uStack_a0 = local_198._240_8_;
    }
    std::
    _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
    ::clear(&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload._M_value.rethrowTargets._M_t);
    if ((_Base_ptr)auStack_88._8_8_ != (_Base_ptr)0x0) {
      *(undefined4 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x110) = auStack_88._0_4_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x118) = auStack_88._8_8_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x120) = auStack_88._16_8_;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x128) = auStack_88._24_8_;
      *(_Base_ptr *)(auStack_88._8_8_ + 8) =
           (_Base_ptr)
           ((long)&(this->labelScanner).
                   super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                   ._M_payload.
                   super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                   .
                   super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                   ._M_payload + 0x110);
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x130) = local_68;
      auStack_88._8_8_ = (_Base_ptr)0x0;
      auStack_88._16_8_ = auStack_88;
      local_68 = 0;
      auStack_88._24_8_ = auStack_88._16_8_;
    }
  }
  else {
    memcpy((void *)((long)&(this->labelScanner).
                           super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                           ._M_payload.
                           super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                           .
                           super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                           ._M_payload + 0x10),local_198 + 0x10,0xa0);
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar22;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._192_8_;
    local_198._176_8_ = (pointer)0x0;
    local_198._184_8_ = (pointer)0x0;
    local_198._192_8_ = (pointer)0x0;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .currFunction = (Function *)local_198._200_8_;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_void>_>
    .currModule = (Module *)local_198._208_8_;
    p_Var11 = (_Base_ptr)
              ((long)&(this->labelScanner).
                      super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                      ._M_payload + 0xe0);
    if ((_Base_ptr)local_198._232_8_ == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xe8) = 0;
      puVar17 = (undefined8 *)
                ((long)&(this->labelScanner).
                        super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                        ._M_payload + 0x100);
      _Var20 = _S_red;
      uVar22 = p_Var11;
    }
    else {
      puVar17 = local_98;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0xe8) = local_198._232_8_;
      *(_Base_ptr *)(local_198._232_8_ + 8) = p_Var11;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x100) = local_98[0];
      local_198._232_8_ = (_Base_ptr)0x0;
      p_Var11 = (_Base_ptr)local_198._240_8_;
      uVar22 = uStack_a0;
      _Var20 = local_198._224_4_;
      local_198._240_8_ = (_Base_ptr)(local_198 + 0xe0);
      uStack_a0 = (_Base_ptr)(local_198 + 0xe0);
    }
    *(_Base_ptr *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0xf0) = p_Var11;
    *(undefined8 *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0xf8) = uVar22;
    *puVar17 = 0;
    BVar21 = builder;
    *(_Rb_tree_color *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0xe0) = _Var20;
    p_Var11 = (_Base_ptr)
              ((long)&(this->labelScanner).
                      super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                      ._M_payload.
                      super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                      .
                      super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                      ._M_payload + 0x110);
    if ((_Base_ptr)auStack_88._8_8_ == (_Base_ptr)0x0) {
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x118) = 0;
      puVar17 = (undefined8 *)
                ((long)&(this->labelScanner).
                        super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                        ._M_payload.
                        super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                        .
                        super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                        ._M_payload + 0x130);
      _Var20 = _S_red;
      p_Var23 = p_Var11;
    }
    else {
      puVar17 = &local_68;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x118) = auStack_88._8_8_;
      *(_Base_ptr *)(auStack_88._8_8_ + 8) = p_Var11;
      *(undefined8 *)
       ((long)&(this->labelScanner).
               super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
               ._M_payload.
               super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
               .
               super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
               ._M_payload + 0x130) = local_68;
      auStack_88._8_8_ = (_Base_ptr)0x0;
      p_Var11 = (_Base_ptr)auStack_88._16_8_;
      p_Var23 = (_Base_ptr)auStack_88._24_8_;
      _Var20 = auStack_88._0_4_;
      auStack_88._16_8_ = (_Base_ptr)auStack_88;
      auStack_88._24_8_ = (_Base_ptr)auStack_88;
    }
    *(_Base_ptr *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0x120) = p_Var11;
    *(_Base_ptr *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0x128) = p_Var23;
    *puVar17 = 0;
    *(_Rb_tree_color *)
     ((long)&(this->labelScanner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
             ._M_payload + 0x110) = _Var20;
    (this->labelScanner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
    ._M_engaged = true;
  }
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
  ::_M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
              *)local_198);
  if ((this->labelScanner).
      super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
      ._M_payload.
      super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
      .
      super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
      ._M_engaged == false) {
    std::__throw_bad_optional_access();
  }
  local_198._216_8_ = &this->labelScanner;
  local_198._0_8_ = (Expression **)0x0;
  local_198._8_8_ = 0;
  local_198._192_8_ = (pointer)0x0;
  local_198._176_8_ = (pointer)0x0;
  local_198._184_8_ = (pointer)0x0;
  local_198._208_8_ = (Module *)0x0;
  local_198._224_8_ = (pointer)0x0;
  local_198._232_8_ = (_Base_ptr)0x0;
  local_198._240_8_ = (_Base_ptr)0x0;
  uStack_a0 = auStack_88 + 0x18;
  local_98[0] = 1;
  local_98[1] = (_Hash_node_base *)0x0;
  auStack_88._0_8_ = (_Hash_node_base *)0x0;
  auStack_88._8_4_ = 0x3f800000;
  auStack_88._16_8_ = (_Base_ptr)0x0;
  auStack_88._24_8_ = (_Base_ptr)0x0;
  local_68 = 0;
  local_198._200_8_ = BVar21.wasm;
  Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  ::pushTask((Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
              *)local_198,ExnrefLocalAssigner::scan,local_50);
  if (((long)(local_198._184_8_ - local_198._176_8_) >> 4) + local_198._8_8_ != 0) {
    do {
      if (local_198._176_8_ == local_198._184_8_) {
        if (local_198._8_8_ == 0) {
          pcVar19 = 
          "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::Task, N = 10]"
          ;
LAB_00b5c74c:
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,pcVar19);
        }
        local_198._8_8_ = local_198._8_8_ - 1;
        p_Var18 = *(TaskFunc *)(local_198 + local_198._8_8_ * 0x10 + 0x10);
        local_198._0_8_ = *(undefined8 *)(local_198 + local_198._8_8_ * 0x10 + 0x18);
      }
      else {
        p_Var18 = ((pointer)(local_198._184_8_ + -0x10))->func;
        local_198._0_8_ = ((pointer)(local_198._184_8_ + -0x10))->currp;
        local_198._184_8_ = (pointer)(local_198._184_8_ + -0x10);
      }
      if (*(Expression **)local_198._0_8_ == (Expression *)0x0) {
        pcVar19 = 
        "void wasm::Walker<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::TranslateToExnref::ExnrefLocalAssigner>]"
        ;
LAB_00b5c716:
        __assert_fail("*task.currp",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                      ,0x132,pcVar19);
      }
      (*p_Var18)((ExnrefLocalAssigner *)local_198,(Expression **)local_198._0_8_);
    } while (((long)(local_198._184_8_ - local_198._176_8_) >> 4) + local_198._8_8_ != 0);
  }
  uVar10 = local_198._184_8_;
  uVar22 = local_198._176_8_;
  local_198._200_8_ = (Function *)0x0;
  local_60 = true;
  bVar1 = (this->localAssigner).
          super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
          ._M_payload.
          super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
          .
          super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
          ._M_engaged;
  (this->localAssigner).
  super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
  ._M_payload.
  super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
  .super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
  ._M_payload._M_value.
  super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  .replacep = local_198._0_8_;
  (this->localAssigner).
  super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
  ._M_payload.
  super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
  .super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
  ._M_payload._M_value.
  super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  .
  super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
  .stack.usedFixed = local_198._8_8_;
  if (bVar1 == true) {
    memcpy((void *)((long)&(this->localAssigner).
                           super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
                           ._M_payload.
                           super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
                           .
                           super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
                           ._M_payload + 0x10),local_198 + 0x10,0xa0);
    pTVar4 = (this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload._M_value.
             super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar5 = (this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload._M_value.
             super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar22;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._192_8_;
    local_198._176_8_ = (pointer)0x0;
    local_198._184_8_ = (pointer)0x0;
    local_198._192_8_ = (pointer)0x0;
    if (pTVar4 != (pointer)0x0) {
      operator_delete(pTVar4,(long)pTVar5 - (long)pTVar4);
    }
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .currFunction = (Function *)local_198._200_8_;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .currModule = (Module *)local_198._208_8_;
    puVar6 = (this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload._M_value.exnrefLocals.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload._M_value.exnrefLocals.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.labelScanner = (TargetTryLabelScanner *)local_198._216_8_;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.exnrefLocals.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_198._224_8_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xe8) = local_198._232_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xec) = local_198._236_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xf0) = local_198._240_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xf4) = local_198._244_4_;
    local_198._224_8_ = (pointer)0x0;
    local_198._232_8_ = (_Base_ptr)0x0;
    local_198._240_8_ = (_Base_ptr)0x0;
    if (puVar6 != (pointer)0x0) {
      operator_delete(puVar6,(long)puVar7 - (long)puVar6);
    }
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_move_assign((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)((long)&(this->localAssigner).
                                super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
                                ._M_payload.
                                super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
                                .
                                super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
                                ._M_payload + 0xf8),&uStack_a0);
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.rethrowTryDepth = local_68;
  }
  else {
    memcpy((void *)((long)&(this->localAssigner).
                           super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
                           ._M_payload.
                           super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
                           .
                           super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
                           ._M_payload + 0x10),local_198 + 0x10,0xa0);
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar22;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)uVar10;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_198._192_8_;
    local_198._192_8_ = (pointer)0x0;
    local_198._176_8_ = (pointer)0x0;
    local_198._184_8_ = (pointer)0x0;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .currFunction = (Function *)local_198._200_8_;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.
    super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .
    super_Walker<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_void>_>
    .currModule = (Module *)local_198._208_8_;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.labelScanner = (TargetTryLabelScanner *)local_198._216_8_;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.exnrefLocals.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_198._224_8_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xe8) = local_198._232_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xec) = local_198._236_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xf0) = local_198._240_4_;
    *(undefined4 *)
     ((long)&(this->localAssigner).
             super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
             ._M_payload.
             super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
             .
             super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
             ._M_payload + 0xf4) = local_198._244_4_;
    local_198._240_8_ = (_Base_ptr)0x0;
    local_198._224_8_ = (pointer)0x0;
    local_198._232_8_ = (_Base_ptr)0x0;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)((long)&(this->localAssigner).
                            super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
                            ._M_payload.
                            super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
                            .
                            super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
                            ._M_payload + 0xf8),&uStack_a0,&uStack_a0);
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_payload._M_value.rethrowTryDepth = local_68;
    (this->localAssigner).
    super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_false,_false>
    ._M_payload.
    super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner,_true,_false,_false>
    .
    super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
    ._M_engaged = true;
  }
  std::_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>::
  _M_reset((_Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::ExnrefLocalAssigner>
            *)local_198);
  pMVar13 = *(Module **)
             ((long)&(this->labelScanner).
                     super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                     .
                     super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                     ._M_payload + 0xf0);
  builder.wasm = (Module *)
                 ((long)&(this->labelScanner).
                         super__Optional_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_false,_false>
                         ._M_payload.
                         super__Optional_payload<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner,_true,_false,_false>
                         .
                         super__Optional_payload_base<wasm::(anonymous_namespace)::TranslateToExnref::TargetTryLabelScanner>
                         ._M_payload + 0xe0);
  if (pMVar13 != builder.wasm) {
    do {
      puVar8 = (pMVar13->functions).
               super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c0,puVar8,
                 (long)&(puVar8->_M_t).
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl +
                 (long)(pMVar13->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
      sVar24 = (string_view)LabelUtils::LabelManager::getUnique(local_1a0,&local_1c0);
      pmVar12 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->delegateTargetToTrampoline,
                             (key_type *)
                             &(pMVar13->functions).
                              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      (pmVar12->super_IString).str = sVar24;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
      }
      pMVar13 = (Module *)std::_Rb_tree_increment((_Rb_tree_node_base *)pMVar13);
    } while (pMVar13 != builder.wasm);
  }
  Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
  ::walk(&(this->
          super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
          ).
          super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
          .
          super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
         ,local_50);
  p_Var14 = std::
            _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::_M_find_before_node
                      (&(this->delegateTargetToTrampoline)._M_h,
                       DAT_010b25a8 % (this->delegateTargetToTrampoline)._M_h._M_bucket_count,
                       (key_type *)&DELEGATE_CALLER_TARGET,DAT_010b25a8);
  if ((p_Var14 != (__node_base_ptr)0x0) && (p_Var14->_M_nxt != (_Hash_node_base *)0x0)) {
    pmVar12 = std::__detail::
              _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->delegateTargetToTrampoline,(key_type *)&DELEGATE_CALLER_TARGET)
    ;
    sVar24 = (pmVar12->super_IString).str;
    pMVar13 = (this->
              super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
              ).
              super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
              .
              super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
              .currModule;
    pFVar9 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>_>
             ).
             super_PostWalker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
             .
             super_Walker<wasm::(anonymous_namespace)::TranslateToExnref,_wasm::Visitor<wasm::(anonymous_namespace)::TranslateToExnref,_void>_>
             .currFunction;
    local_48.wasm = pMVar13;
    SVar25 = HeapType::getSignature(&pFVar9->type);
    if (SVar25.results.id.id < 2) {
      pEVar15 = (Expression *)MixedArena::allocSpace(&pMVar13->allocator,0x18,8);
      pEVar15->_id = ReturnId;
      (pEVar15->type).id = 1;
      *(undefined8 *)(pEVar15 + 1) = 0;
      any = pFVar9->body;
    }
    else {
      pEVar15 = pFVar9->body;
      any = (Expression *)MixedArena::allocSpace(&pMVar13->allocator,0x18,8);
      any->_id = ReturnId;
      (any->type).id = 1;
      *(Expression **)(any + 1) = pEVar15;
      pEVar15 = (Expression *)0x0;
    }
    local_198[8] = 1;
    local_198._0_8_ = (Expression **)0x4a;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = local_198._8_8_;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)0x4a;
    pBVar16 = Builder::blockifyWithName(&local_48,any,(Name)sVar24,pEVar15,type);
    this_00 = (ThrowRef *)MixedArena::allocSpace(&(local_48.wasm)->allocator,0x18,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression._id = ThrowRefId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)56>).super_Expression.type.id = 0;
    this_00->exnref = (Expression *)pBVar16;
    ThrowRef::finalize(this_00);
    pFVar9->body = (Expression *)this_00;
  }
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    labels = std::make_optional<LabelUtils::LabelManager>(func);
    labelScanner = std::make_optional<TargetTryLabelScanner>(func);
    localAssigner =
      std::make_optional<ExnrefLocalAssigner>(func, &labelScanner.value());

    // Create a unique br target label for each existing delegate target label,
    // because we are going to achieve 'delegate's effects with 'br's. See
    // processDelegateTarget() for details.
    for (auto& target : labelScanner->delegateTargets) {
      delegateTargetToTrampoline[target] = labels->getUnique(target.toString());
    }

    Super::doWalkFunction(func);

    // Similar to processDelegateTarget(), but for the caller target.
    if (delegateTargetToTrampoline.find(DELEGATE_CALLER_TARGET) !=
        delegateTargetToTrampoline.end()) {
      processCallerDelegateTarget();
    }
  }